

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O2

void LiteScript::State::Save(ostream *stream,State *state)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pVVar4;
  pointer pNVar5;
  pointer pNVar6;
  pointer pVVar7;
  pointer paVar8;
  pointer paVar9;
  pointer pNVar10;
  pointer pNVar11;
  OStreamer *pOVar12;
  Object *pOVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  OStreamer streamer;
  
  streamer.stream = stream;
  pOVar12 = OStreamer::operator<<(&streamer,&state->instr_index);
  OStreamer::operator<<(pOVar12,&state->line_num);
  pOVar13 = Variable::operator->(&state->nsp_global);
  OStreamer::operator<<(&streamer,&pOVar13->ID);
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pvVar1 = (state->args_tmp).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (state->args_tmp).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar15 = 0; uVar15 != (((long)pvVar1 - (long)pvVar2) / 0x18 & 0xffffffffU);
      uVar15 = uVar15 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
    pvVar3 = (state->args_tmp).
             super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar4 = *(pointer *)
              ((long)&pvVar3[uVar15].
                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar16 = *(long *)&pvVar3[uVar15].
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data;
    for (uVar14 = 0; ((long)pVVar4 - lVar16 & 0xffffffff0U) != uVar14; uVar14 = uVar14 + 0x10) {
      pOVar13 = Variable::operator->
                          ((Variable *)
                           (*(long *)&(state->args_tmp).
                                      super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                      ._M_impl.super__Vector_impl_data + uVar14));
      OStreamer::operator<<(&streamer,&pOVar13->ID);
    }
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pvVar1 = (state->args_def).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (state->args_def).
           super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar15 = 0; uVar15 != (((long)pvVar1 - (long)pvVar2) / 0x18 & 0xffffffffU);
      uVar15 = uVar15 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
    pvVar3 = (state->args_def).
             super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar4 = *(pointer *)
              ((long)&pvVar3[uVar15].
                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                      ._M_impl.super__Vector_impl_data + 8);
    lVar16 = *(long *)&pvVar3[uVar15].
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data;
    for (uVar14 = 0; ((long)pVVar4 - lVar16 & 0xffffffff0U) != uVar14; uVar14 = uVar14 + 0x10) {
      pOVar13 = Variable::operator->
                          ((Variable *)
                           (*(long *)&(state->args_def).
                                      super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar15].
                                      super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                      ._M_impl.super__Vector_impl_data + uVar14));
      OStreamer::operator<<(&streamer,&pOVar13->ID);
    }
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pNVar5 = (state->ths).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar6 = (state->ths).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar15 = 0; ((long)pNVar5 - (long)pNVar6 & 0x1fffffffe0U) != uVar15; uVar15 = uVar15 + 0x20)
  {
    if (**(char **)(((state->ths).
                     super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->data + uVar15 + 0x18) == '\x01') {
      std::operator<<(streamer.stream,'\0');
    }
    else {
      std::operator<<(streamer.stream,'\x01');
      pOVar13 = Variable::operator->
                          ((Variable *)
                           (((state->ths).
                             super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data + uVar15));
      OStreamer::operator<<(&streamer,&pOVar13->ID);
    }
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pNVar5 = (state->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar6 = (state->rets).
           super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar15 = 0; ((long)pNVar5 - (long)pNVar6 & 0x1fffffffe0U) != uVar15; uVar15 = uVar15 + 0x20)
  {
    if (**(char **)(((state->rets).
                     super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->data + uVar15 + 0x18) == '\x01') {
      std::operator<<(streamer.stream,'\0');
    }
    else {
      std::operator<<(streamer.stream,'\x01');
      pOVar13 = Variable::operator->
                          ((Variable *)
                           (((state->rets).
                             super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->data + uVar15));
      OStreamer::operator<<(&streamer,&pOVar13->ID);
    }
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pVVar4 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar7 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar15 = 0; ((long)pVVar4 - (long)pVVar7 & 0xffffffff0U) != uVar15; uVar15 = uVar15 + 0x10) {
    pOVar13 = Variable::operator->
                        ((Variable *)
                         ((long)&((state->op_lifo).
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->obj + uVar15));
    OStreamer::operator<<(&streamer,&pOVar13->ID);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  paVar8 = (state->call_lifo).
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar9 = (state->call_lifo).
           super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar15 = 0; ((long)paVar8 - (long)paVar9 & 0x7fffffff8U) != uVar15; uVar15 = uVar15 + 8) {
    pOVar12 = OStreamer::operator<<
                        (&streamer,
                         (uint *)((long)((state->call_lifo).
                                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 uVar15));
    OStreamer::operator<<
              (pOVar12,(uint *)((long)((state->call_lifo).
                                       super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                               uVar15 + 4));
  }
  std::ostream::_M_insert<unsigned_long>((ulong)streamer.stream);
  pNVar10 = (state->nsp_lifo).
            super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pNVar11 = (state->nsp_lifo).
            super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar16 = 0; (((long)pNVar10 - (long)pNVar11) / 0x48 & 0xffffffffU) * 0x48 - lVar16 != 0;
      lVar16 = lVar16 + 0x48) {
    Namer::SaveIDs((Namer *)((((state->nsp_lifo).
                               super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->current).data +
                            lVar16 + -0x10),stream);
  }
  return;
}

Assistant:

void LiteScript::State::Save(std::ostream &stream, const State &state) {
    OStreamer streamer(stream);
    streamer << state.instr_index << state.line_num;
    streamer << state.nsp_global->ID;
    streamer << state.args_tmp.size();
    for (unsigned int i = 0, sz_i = state.args_tmp.size(); i < sz_i; i++) {
        streamer << state.args_tmp[i].size();
        for (unsigned int j = 0, sz_j = state.args_tmp[i].size(); j < sz_j; j++)
            streamer << state.args_tmp[i][j]->ID;
    }
    streamer << state.args_def.size();
    for (unsigned int i = 0, sz_i = state.args_def.size(); i < sz_i; i++) {
        streamer << state.args_def[i].size();
        for (unsigned int j = 0, sz_j = state.args_def[i].size(); j < sz_j; j++)
            streamer << state.args_def[i][j]->ID;
    }
    streamer << state.ths.size();
    for (unsigned int i = 0, sz = state.ths.size(); i < sz; i++) {
        if (state.ths[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.ths[i])->ID;
    }
    streamer << state.rets.size();
    for (unsigned int i = 0, sz = state.rets.size(); i < sz; i++) {
        if (state.rets[i].isNull)
            streamer << (unsigned char)0;
        else
            streamer << (unsigned char)1 << (*state.rets[i])->ID;
    }
    streamer << state.op_lifo.size();
    for (unsigned int i = 0, sz = state.op_lifo.size(); i < sz; i++)
        streamer << state.op_lifo[i]->ID;
    streamer << state.call_lifo.size();
    for (unsigned int i = 0, sz = state.call_lifo.size(); i < sz; i++)
        streamer << state.call_lifo[i][0] << state.call_lifo[i][1];
    streamer << state.nsp_lifo.size();
    for (unsigned int i = 0, sz = state.nsp_lifo.size(); i < sz; i++)
        state.nsp_lifo[i].SaveIDs(stream);
 }